

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_verifier.cpp
# Opt level: O0

FUNCTION_RETURN license::os::verify_signature(string *stringToVerify,string *signatureB64)

{
  int iVar1;
  uint uVar2;
  BIO *pBVar3;
  RSA *key;
  int *piVar4;
  BIO_METHOD *type;
  void *buf;
  BIO *append;
  EVP_MD_CTX *pEVar5;
  EVP_MD *type_00;
  undefined8 uVar6;
  undefined8 uVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double dVar8;
  FUNCTION_RETURN result;
  uint len;
  BIO *biosig;
  BIO *encoded_signature;
  BIO *b64;
  uchar buffer [512];
  EVP_PKEY *pkey;
  RSA *rsa;
  BIO *bio;
  undefined1 local_b8 [4];
  int func_ret;
  uchar pubKey [140];
  EVP_MD_CTX *mdctx;
  string *signatureB64_local;
  string *stringToVerify_local;
  
  stack0xffffffffffffffd8 = (EVP_MD_CTX *)0x0;
  memcpy(local_b8,&DAT_00479280,0x8c);
  initialize();
  pBVar3 = BIO_new_mem_buf(local_b8,0x8c);
  key = d2i_RSAPublicKey_bio(pBVar3,(RSA **)0x0);
  BIO_free(pBVar3);
  if (key == (RSA *)0x0) {
    piVar4 = __errno_location();
    dVar8 = extraout_XMM0_Qa;
    if (*piVar4 != 0) {
      piVar4 = __errno_location();
      strerror(*piVar4);
      dVar8 = extraout_XMM0_Qa_00;
    }
    _log(dVar8);
    stringToVerify_local._4_4_ = FUNC_RET_ERROR;
  }
  else {
    buffer._504_8_ = EVP_PKEY_new();
    EVP_PKEY_assign((EVP_PKEY *)buffer._504_8_,6,key);
    type = BIO_f_base64();
    pBVar3 = BIO_new(type);
    buf = (void *)std::__cxx11::string::c_str();
    iVar1 = std::__cxx11::string::size();
    append = BIO_new_mem_buf(buf,iVar1);
    pBVar3 = BIO_push(pBVar3,append);
    BIO_set_flags(pBVar3,0x100);
    iVar1 = std::__cxx11::string::size();
    uVar2 = BIO_read(pBVar3,&b64,iVar1);
    buffer[(ulong)uVar2 - 8] = '\0';
    BIO_free_all(pBVar3);
    pEVar5 = (EVP_MD_CTX *)EVP_MD_CTX_new();
    unique0x1000043e = pEVar5;
    if (pEVar5 == (EVP_MD_CTX *)0x0) {
      free_resources((EVP_PKEY *)buffer._504_8_,(EVP_MD_CTX *)0x0);
      piVar4 = __errno_location();
      dVar8 = extraout_XMM0_Qa_01;
      if (*piVar4 != 0) {
        piVar4 = __errno_location();
        strerror(*piVar4);
        dVar8 = extraout_XMM0_Qa_02;
      }
      _log(dVar8);
      stringToVerify_local._4_4_ = FUNC_RET_ERROR;
    }
    else {
      type_00 = EVP_sha256();
      iVar1 = EVP_DigestVerifyInit
                        (pEVar5,(EVP_PKEY_CTX **)0x0,type_00,(ENGINE *)0x0,
                         (EVP_PKEY *)buffer._504_8_);
      pEVar5 = stack0xffffffffffffffd8;
      if (iVar1 == 1) {
        uVar6 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::size();
        iVar1 = EVP_DigestVerifyUpdate(pEVar5,uVar6,uVar7);
        if (iVar1 == 1) {
          iVar1 = EVP_DigestVerifyFinal(stack0xffffffffffffffd8,(uchar *)&b64,(ulong)uVar2);
          if (iVar1 != 1) {
            piVar4 = __errno_location();
            dVar8 = extraout_XMM0_Qa_07;
            if (*piVar4 != 0) {
              piVar4 = __errno_location();
              strerror(*piVar4);
              dVar8 = extraout_XMM0_Qa_08;
            }
            _log(dVar8);
          }
          stringToVerify_local._4_4_ = FUNC_RET_ERROR;
          if (iVar1 == 1) {
            stringToVerify_local._4_4_ = FUNC_RET_OK;
          }
          free_resources((EVP_PKEY *)buffer._504_8_,(EVP_MD_CTX *)stack0xffffffffffffffd8);
        }
        else {
          piVar4 = __errno_location();
          dVar8 = extraout_XMM0_Qa_05;
          if (*piVar4 != 0) {
            piVar4 = __errno_location();
            strerror(*piVar4);
            dVar8 = extraout_XMM0_Qa_06;
          }
          _log(dVar8);
          free_resources((EVP_PKEY *)buffer._504_8_,(EVP_MD_CTX *)stack0xffffffffffffffd8);
          stringToVerify_local._4_4_ = FUNC_RET_ERROR;
        }
      }
      else {
        piVar4 = __errno_location();
        dVar8 = extraout_XMM0_Qa_03;
        if (*piVar4 != 0) {
          piVar4 = __errno_location();
          strerror(*piVar4);
          dVar8 = extraout_XMM0_Qa_04;
        }
        _log(dVar8);
        free_resources((EVP_PKEY *)buffer._504_8_,(EVP_MD_CTX *)stack0xffffffffffffffd8);
        stringToVerify_local._4_4_ = FUNC_RET_ERROR;
      }
    }
  }
  return stringToVerify_local._4_4_;
}

Assistant:

FUNCTION_RETURN verify_signature(const std::string& stringToVerify, const std::string& signatureB64) {
	EVP_MD_CTX* mdctx = NULL;
	const unsigned char pubKey[] = PUBLIC_KEY;
	int func_ret = 0;
	initialize();

	BIO* bio = BIO_new_mem_buf((void*)(pubKey), sizeof(pubKey));
	RSA* rsa = d2i_RSAPublicKey_bio(bio, NULL);
	BIO_free(bio);
	if (rsa == NULL) {
		LOG_ERROR("Error reading public key");
		return FUNC_RET_ERROR;
	}
	EVP_PKEY* pkey = EVP_PKEY_new();
	EVP_PKEY_assign_RSA(pkey, rsa);

	/*BIO* bo = BIO_new(BIO_s_mem());
	 BIO_write(bo, pubKey, strlen(pubKey));
	 RSA *key = 0;
	 PEM_read_bio_RSAPublicKey(bo, &key, 0, 0);
	 BIO_free(bo);*/

	// RSA* rsa = EVP_PKEY_get1_RSA( key );
	// RSA * pubKey = d2i_RSA_PUBKEY(NULL, <der encoded byte stream pointer>, <num bytes>);
	unsigned char buffer[512];
	BIO* b64 = BIO_new(BIO_f_base64());
	BIO* encoded_signature = BIO_new_mem_buf((const void*)signatureB64.c_str(), signatureB64.size());
	BIO* biosig = BIO_push(b64, encoded_signature);
	BIO_set_flags(biosig, BIO_FLAGS_BASE64_NO_NL);  // Do not use newlines to flush buffer
	unsigned int len = BIO_read(biosig, (void*)buffer, signatureB64.size());
	// Can test here if len == decodeLen - if not, then return an error
	buffer[len] = 0;

	BIO_free_all(biosig);

	/* Create the Message Digest Context */
	if (!(mdctx = EVP_MD_CTX_create())) {
		free_resources(pkey, mdctx);
		LOG_ERROR("Error creating context");
		return FUNC_RET_ERROR;
	}
	if (1 != EVP_DigestVerifyInit(mdctx, NULL, EVP_sha256(), NULL, pkey)) {
		LOG_ERROR("Error initializing digest");
		free_resources(pkey, mdctx);
		return FUNC_RET_ERROR;
	}

	func_ret = EVP_DigestVerifyUpdate(mdctx, (const void*)stringToVerify.c_str(), stringToVerify.size());
	if (1 != func_ret) {
		LOG_ERROR("Error verifying digest %d", func_ret);
		free_resources(pkey, mdctx);
		return FUNC_RET_ERROR;
	}
	FUNCTION_RETURN result;
	func_ret = EVP_DigestVerifyFinal(mdctx, buffer, len);
	if (1 != func_ret) {
		LOG_ERROR("Error verifying digest %d", func_ret);
	}
	result = (1 == func_ret ? FUNC_RET_OK : FUNC_RET_ERROR);

	free_resources(pkey, mdctx);
	return result;
}